

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O0

void avro::json::testLong(TestData<long> *d)

{
  bool bVar1;
  long in_RDI;
  Entity n;
  basic_cstring<const_char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  lazy_ostream *in_stack_ffffffffffffff08;
  size_t line_num;
  const_string *in_stack_ffffffffffffff18;
  unit_test_log_t *in_stack_ffffffffffffff20;
  undefined1 local_d0 [56];
  basic_cstring<const_char> local_98;
  EntityType local_84;
  basic_cstring<const_char> local_80;
  undefined1 local_70 [72];
  basic_cstring<const_char> local_28;
  Entity local_18 [16];
  long local_8;
  
  local_8 = in_RDI;
  avro::json::loadEntity((char *)local_18);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffed0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,line_num,
               (const_string *)in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff08 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffed8,(char (*) [1])in_stack_fffffffffffffed0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    local_84 = Entity::type(local_18);
    in_stack_fffffffffffffed0 = (basic_cstring<const_char> *)(local_8 + 8);
    in_stack_fffffffffffffed8 = "d.type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
              (local_70,&local_80,0x51,1,2,&local_84,"n.type()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x21d362);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffed0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,line_num,
               (const_string *)in_stack_ffffffffffffff08);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffed8,(char (*) [1])in_stack_fffffffffffffed0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xffffffffffffff20,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    in_stack_ffffffffffffff18 =
         (const_string *)Entity::longValue((Entity *)in_stack_fffffffffffffed0);
    in_stack_fffffffffffffed0 = (basic_cstring<const_char> *)(local_8 + 0x10);
    in_stack_fffffffffffffed8 = "d.value";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_d0,&stack0xffffffffffffff20,0x52,1,2,&stack0xffffffffffffff18,"n.longValue()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x21d486);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Entity::~Entity((Entity *)0x21d4ac);
  return;
}

Assistant:

void testLong(const TestData<int64_t>& d)
{
    Entity n = loadEntity(d.input);
    BOOST_CHECK_EQUAL(n.type(), d.type);
    BOOST_CHECK_EQUAL(n.longValue(), d.value);
}